

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void Luv32fromLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  short *local_30;
  int16_t *luv3;
  uint32_t *luv;
  tmsize_t n_local;
  uint8_t *op_local;
  LogLuvState *sp_local;
  
  luv3 = (int16_t *)sp->tbuf;
  local_30 = (short *)op;
  luv = (uint32_t *)n;
  if (sp->encode_meth == 0) {
    while (0 < (long)luv) {
      *(uint *)luv3 =
           (int)*local_30 << 0x10 | (uint)(local_30[1] * 0x19a) >> 7 & 0xff00 |
           (uint)(local_30[2] * 0x19a) >> 0xf & 0xff;
      local_30 = local_30 + 3;
      luv3 = luv3 + 2;
      luv = (uint32_t *)((long)luv + -1);
    }
  }
  else {
    while (0 < (long)luv) {
      sVar1 = *local_30;
      uVar2 = tiff_itrunc((double)(int)local_30[1] * 0.01251220703125,sp->encode_meth);
      uVar3 = tiff_itrunc((double)(int)local_30[2] * 0.01251220703125,sp->encode_meth);
      *(uint *)luv3 = (int)sVar1 << 0x10 | (uVar2 & 0xff) << 8 | uVar3 & 0xff;
      local_30 = local_30 + 3;
      luv3 = luv3 + 2;
      luv = (uint32_t *)((long)luv + -1);
    }
  }
  return;
}

Assistant:

static void Luv32fromLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    if (sp->encode_meth == SGILOGENCODE_NODITHER)
    {
        while (n-- > 0)
        {
            *luv++ = (uint32_t)luv3[0] << 16 |
                     (luv3[1] * (uint32_t)(UVSCALE + .5) >> 7 & 0xff00) |
                     (luv3[2] * (uint32_t)(UVSCALE + .5) >> 15 & 0xff);
            luv3 += 3;
        }
        return;
    }
    while (n-- > 0)
    {
        *luv++ =
            (uint32_t)luv3[0] << 16 |
            (tiff_itrunc(luv3[1] * (UVSCALE / (1 << 15)), sp->encode_meth)
                 << 8 &
             0xff00) |
            (tiff_itrunc(luv3[2] * (UVSCALE / (1 << 15)), sp->encode_meth) &
             0xff);
        luv3 += 3;
    }
}